

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::VariableExpr> __thiscall minja::Parser::parseIdentifier(Parser *this)

{
  int iVar1;
  ulong uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<minja::VariableExpr> sVar3;
  SpaceHandling in_stack_0000001c;
  string ident;
  Location location;
  element_type *this_00;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  Location *in_stack_ffffffffffffffb8;
  flag_type in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffd0;
  Parser *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  if (parseIdentifier()::ident_regex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&parseIdentifier()::ident_regex_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseIdentifier()::ident_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseIdentifier()::ident_regex_abi_cxx11_);
    }
  }
  get_location(in_stack_ffffffffffffffd8);
  consumeToken((Parser *)ident._M_string_length,(regex *)ident._0_8_,in_stack_0000001c);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::make_shared<minja::VariableExpr,minja::Location&,std::__cxx11::string&>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    std::shared_ptr<minja::VariableExpr>::shared_ptr
              ((shared_ptr<minja::VariableExpr> *)this_00,in_RDI);
  }
  std::__cxx11::string::~string(local_58);
  Location::~Location((Location *)0x33de4d);
  sVar3.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<minja::VariableExpr>)
         sVar3.super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VariableExpr> parseIdentifier() {
        static std::regex ident_regex(R"((?!(?:not|is|and|or|del)\b)[a-zA-Z_]\w*)");
        auto location = get_location();
        auto ident = consumeToken(ident_regex);
        if (ident.empty())
          return nullptr;
        return std::make_shared<VariableExpr>(location, ident);
    }